

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_device__on_notification(ma_device_notification notification)

{
  int in_ESI;
  long in_RDI;
  long local_18;
  int local_10;
  
  if (in_RDI != 0) {
    if (*(code **)(in_RDI + 0x20) != (code *)0x0) {
      local_18 = in_RDI;
      local_10 = in_ESI;
      (**(code **)(in_RDI + 0x20))(&local_18);
      in_RDI = local_18;
      in_ESI = local_10;
    }
    if ((*(code **)(in_RDI + 0x28) != (code *)0x0) && (in_ESI == 1)) {
      (**(code **)(in_RDI + 0x28))();
    }
    return;
  }
  __assert_fail("notification.pDevice != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x1a52,"void ma_device__on_notification(ma_device_notification)");
}

Assistant:

static void ma_device__on_notification(ma_device_notification notification)
{
    MA_ASSERT(notification.pDevice != NULL);

    if (notification.pDevice->onNotification != NULL) {
        notification.pDevice->onNotification(&notification);
    }

    /* TEMP FOR COMPATIBILITY: If it's a stopped notification, fire the onStop callback as well. This is only for backwards compatibility and will be removed. */
    if (notification.pDevice->onStop != NULL && notification.type == ma_device_notification_type_stopped) {
        notification.pDevice->onStop(notification.pDevice);
    }
}